

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<8> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<8>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,_embree::avx::CreateLeafSpatial<8,_embree::TriangleMv<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  PrimInfoExtRange *set;
  Vec3fa VVar3;
  byte bVar4;
  undefined4 uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  ThreadLocal2 *this_00;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  char cVar11;
  size_t i_1;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  *p_Var12;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_01;
  ulong uVar13;
  NodeRefPtr<8> NVar14;
  long lVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar16;
  ulong uVar17;
  size_t sVar18;
  runtime_error *this_02;
  unsigned_long *puVar19;
  ulong uVar20;
  AABBNode_t<embree::NodeRefPtr<8>,_8> *node;
  undefined1 *puVar21;
  char *pcVar22;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *current_00;
  size_t i_3;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  Split split_1;
  NodeRefPtr<4> values [16];
  Split split;
  PrimInfoExtRange rprims;
  PrimInfoExtRange lprims;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  anon_class_24_3_c379faaa local_a58;
  undefined1 local_a40 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_a20;
  BBox3fa local_a10;
  unsigned_long local_9f0;
  unsigned_long uStack_9e8;
  unsigned_long local_9e0;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_9c0;
  anon_class_8_1_898bcfc2_conflict local_938;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_930;
  Split local_8c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_840;
  undefined8 uStack_830;
  undefined8 uStack_828;
  BBox3fa local_820;
  unsigned_long local_800;
  unsigned_long uStack_7f8;
  unsigned_long local_7f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_7e0;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  unsigned_long local_7a0;
  unsigned_long uStack_798;
  unsigned_long local_790;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_780 [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc->super_Create).allocator;
    p_Var12 = (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
               *)__tls_get_addr(&PTR_021f8d38);
    this_01._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         p_Var12->_M_t;
    if ((_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         )this_01._M_t.
          super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl ==
        (ThreadLocal2 *)0x0) {
      this_01._M_t.
      super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
           (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            )FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)
                         this_01._M_t.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl);
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p = (__pointer_type)0x0;
      ((ThreadLocal *)
      ((long)this_01._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x40))->parent =
           (ThreadLocal2 *)
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      auVar25 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x48) = ZEXT1632(auVar25);
      *(undefined1 (*) [32])
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x58) = ZEXT1632(auVar25);
      ((ThreadLocal *)
      ((long)this_01._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
      0x80))->parent =
           (ThreadLocal2 *)
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      *(undefined1 (*) [32])
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x88) = ZEXT1632(auVar25);
      *(undefined1 (*) [32])
       ((long)this_01._M_t.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
       0x98) = ZEXT1632(auVar25);
      p_Var12->_M_t =
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      local_780[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      local_780[0].alloc_barrier = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_a40._0_8_ =
           this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_a40);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)local_a40);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_780);
    }
    alloc.talloc0 =
         (ThreadLocal *)
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x40);
    alloc.talloc1 =
         (ThreadLocal *)
         ((long)this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         0x80);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  set = &current->prims;
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
            (&local_8c0,this->heuristic,set,(this->cfg).logBlockSize);
  bVar4 = (byte)(this->cfg).logBlockSize;
  uVar6 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  uVar7 = (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin;
  uVar13 = uVar6 - uVar7;
  if ((uVar13 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_00c7e490:
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    deterministic_order(this->heuristic,set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    NVar14 = createLargeLeaf(this,current,alloc_00);
    return (NodeRefPtr<8>)NVar14.ptr;
  }
  if (uVar13 <= (this->cfg).maxLeafSize) {
    auVar10 = vsubps_avx((undefined1  [16])
                         (current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0,
                         (undefined1  [16])
                         (current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0);
    auVar25 = vmovshdup_avx(auVar10);
    auVar9 = vshufpd_avx(auVar10,auVar10,1);
    fVar8 = auVar10._0_4_ * (auVar25._0_4_ + auVar9._0_4_) + auVar25._0_4_ * auVar9._0_4_;
    fVar24 = (this->cfg).intCost;
    if (fVar24 * fVar8 * (float)((~(-1L << (bVar4 & 0x3f)) + uVar6) - uVar7 >> (bVar4 & 0x3f)) <=
        fVar8 * (this->cfg).travCost + fVar24 * local_8c0.sah) goto LAB_00c7e490;
  }
  HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::split
            (this->heuristic,&local_8c0,set,(PrimInfoExtRange *)&local_7e0.field_1,
             (PrimInfoExtRange *)&local_840.field_1);
  local_a40._0_8_ = current->depth + 1;
  local_a40[8] = false;
  local_a30._0_8_ = local_7e0._0_8_;
  local_a30._8_8_ = local_7e0._8_8_;
  aStack_a20._0_8_ = uStack_7d0;
  aStack_a20._8_8_ = uStack_7c8;
  local_9f0 = local_7a0;
  uStack_9e8 = uStack_798;
  local_9e0 = local_790;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  ::operator=(local_780,
              (BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
               *)local_a40);
  local_a40._0_8_ = current->depth + 1;
  local_a40[8] = false;
  local_a30._0_8_ = local_840._0_8_;
  local_a30._8_8_ = local_840._8_8_;
  aStack_a20._0_8_ = uStack_830;
  aStack_a20._8_8_ = uStack_828;
  local_a10 = local_820;
  local_9f0 = local_800;
  uStack_9e8 = uStack_7f8;
  local_9e0 = local_7f0;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  ::operator=(local_780 + 1,
              (BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
               *)local_a40);
  for (uVar13 = 2; uVar13 < (this->cfg).branchingFactor; uVar13 = uVar13 + 1) {
    puVar19 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar17 = 0xffffffffffffffff;
    fVar24 = -INFINITY;
    for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
      if ((this->cfg).minLeafSize < *puVar19 - ((range<unsigned_long> *)(puVar19 + -1))->_begin) {
        auVar10 = vsubps_avx(*(undefined1 (*) [16])(puVar19 + -7),
                             *(undefined1 (*) [16])(puVar19 + -9));
        auVar25 = vmovshdup_avx(auVar10);
        auVar9 = vshufpd_avx(auVar10,auVar10,1);
        fVar8 = auVar10._0_4_ * (auVar25._0_4_ + auVar9._0_4_) + auVar25._0_4_ * auVar9._0_4_;
        if (fVar24 < fVar8) {
          uVar17 = uVar20;
          fVar24 = fVar8;
        }
      }
      puVar19 = puVar19 + 0xe;
    }
    if (uVar17 == 0xffffffffffffffff) break;
    local_9c0.depth = current->depth + 1;
    local_9c0.alloc_barrier = false;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[0] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[1] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[3] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[2] = -INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ = 0xff800000ff800000;
    local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0.m128[3] = -INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[0] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[1] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[2] = INFINITY;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[3] = INFINITY;
    local_9c0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long> =
         (range<unsigned_long>)(ZEXT816(0) << 0x40);
    local_9c0.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_930._8_8_ = local_930._8_8_ & 0xffffffffffffff00;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 0x7f8000007f800000;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[2] = INFINITY;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0.m128[3] = INFINITY;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[0] = INFINITY;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[1] = INFINITY;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[2] = INFINITY;
    local_930.prims.super_CentGeomBBox3fa.centBounds.lower.field_0.m128[3] = INFINITY;
    local_930.prims.super_extended_range<unsigned_long>._ext_end = 0;
    local_9c0.prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
    local_930.depth = local_9c0.depth;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
    local_930.prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         local_9c0.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
    local_930.prims.super_extended_range<unsigned_long>.super_range<unsigned_long> =
         local_9c0.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>;
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    find((Split *)local_a40,this->heuristic,&local_780[uVar17].prims,(this->cfg).logBlockSize);
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    split(this->heuristic,(Split *)local_a40,&local_780[uVar17].prims,&local_9c0.prims,
          &local_930.prims);
    BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780 + uVar17,&local_9c0);
    BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
    ::operator=(local_780 + uVar13,&local_930);
  }
  uVar17 = (this->cfg).primrefarrayalloc;
  if (uVar17 < (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end
               - (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _begin) {
    puVar19 = &local_780[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar20 = uVar13;
    while (bVar23 = uVar20 != 0, uVar20 = uVar20 - 1, bVar23) {
      *(bool *)(puVar19 + -10) =
           *puVar19 - ((range<unsigned_long> *)(puVar19 + -1))->_begin <= uVar17;
      puVar19 = puVar19 + 0xe;
    }
  }
  current_00 = local_780;
  std::
  __sort<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>>>>
            (current_00,local_780 + uVar13);
  local_a58.values = (NodeRefPtr<4> (*) [16])&DAT_00000100;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_9c0.alloc_barrier = true;
    local_9c0.depth = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar26._0_8_;
    (this_00->alloc0).allocBlockSize = auVar26._8_8_;
    (this_00->alloc0).bytesUsed = auVar26._16_8_;
    (this_00->alloc0).bytesWasted = auVar26._24_8_;
    (this_00->alloc0).ptr = (char *)auVar26._0_8_;
    (this_00->alloc0).cur = auVar26._8_8_;
    (this_00->alloc0).end = auVar26._16_8_;
    (this_00->alloc0).allocBlockSize = auVar26._24_8_;
    auVar26 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar26._0_8_;
      (this_00->alloc1).allocBlockSize = auVar26._8_8_;
      (this_00->alloc1).bytesUsed = auVar26._16_8_;
      (this_00->alloc1).bytesWasted = auVar26._24_8_;
      (this_00->alloc1).ptr = (char *)auVar26._0_8_;
      (this_00->alloc1).cur = auVar26._8_8_;
      (this_00->alloc1).end = auVar26._16_8_;
      (this_00->alloc1).allocBlockSize = auVar26._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar26._0_8_;
      (this_00->alloc1).cur = auVar26._8_8_;
      (this_00->alloc1).end = auVar26._16_8_;
      (this_00->alloc1).allocBlockSize = auVar26._24_8_;
      (this_00->alloc1).end = auVar26._0_8_;
      (this_00->alloc1).allocBlockSize = auVar26._8_8_;
      (this_00->alloc1).bytesUsed = auVar26._16_8_;
      (this_00->alloc1).bytesWasted = auVar26._24_8_;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_a40._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_a40[8] = true;
    local_930.depth = (size_t)this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_930);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_a40);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_9c0);
  }
  (alloc.talloc0)->bytesUsed =
       (size_t)((long)&((MutexSys *)*local_a58.values)->mutex + (alloc.talloc0)->bytesUsed);
  sVar18 = (alloc.talloc0)->cur;
  uVar17 = (ulong)(-(int)sVar18 & 0x1f);
  puVar21 = (undefined1 *)((long)&((MutexSys *)*local_a58.values)->mutex + uVar17 + sVar18);
  (alloc.talloc0)->cur = (size_t)puVar21;
  if ((undefined1 *)(alloc.talloc0)->end < puVar21) {
    (alloc.talloc0)->cur = sVar18;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize <
        (ThreadLocal2 *)((long)local_a58.values << 2)) {
      pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_a58);
    }
    else {
      local_a40._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_a40);
      (alloc.talloc0)->ptr = pcVar22;
      sVar18 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar18;
      (alloc.talloc0)->end = local_a40._0_8_;
      (alloc.talloc0)->cur = (size_t)local_a58.values;
      if ((ulong)local_a40._0_8_ < local_a58.values) {
        (alloc.talloc0)->cur = 0;
        local_a40._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_a40);
        (alloc.talloc0)->ptr = pcVar22;
        sVar18 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar18;
        (alloc.talloc0)->end = local_a40._0_8_;
        (alloc.talloc0)->cur = (size_t)local_a58.values;
        if ((ulong)local_a40._0_8_ < local_a58.values) {
          (alloc.talloc0)->cur = 0;
          pcVar22 = (char *)0x0;
          goto LAB_00c7e915;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar18;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar17;
    pcVar22 = (alloc.talloc0)->ptr + ((long)puVar21 - (long)local_a58.values);
  }
LAB_00c7e915:
  pcVar22[0xc0] = '\0';
  pcVar22[0xc1] = '\0';
  pcVar22[0xc2] = -0x80;
  pcVar22[0xc3] = '\x7f';
  pcVar22[0xc4] = '\0';
  pcVar22[0xc5] = '\0';
  pcVar22[0xc6] = -0x80;
  pcVar22[199] = '\x7f';
  pcVar22[200] = '\0';
  pcVar22[0xc9] = '\0';
  pcVar22[0xca] = -0x80;
  pcVar22[0xcb] = '\x7f';
  pcVar22[0xcc] = '\0';
  pcVar22[0xcd] = '\0';
  pcVar22[0xce] = -0x80;
  pcVar22[0xcf] = '\x7f';
  pcVar22[0xd0] = '\0';
  pcVar22[0xd1] = '\0';
  pcVar22[0xd2] = -0x80;
  pcVar22[0xd3] = '\x7f';
  pcVar22[0xd4] = '\0';
  pcVar22[0xd5] = '\0';
  pcVar22[0xd6] = -0x80;
  pcVar22[0xd7] = '\x7f';
  pcVar22[0xd8] = '\0';
  pcVar22[0xd9] = '\0';
  pcVar22[0xda] = -0x80;
  pcVar22[0xdb] = '\x7f';
  pcVar22[0xdc] = '\0';
  pcVar22[0xdd] = '\0';
  pcVar22[0xde] = -0x80;
  pcVar22[0xdf] = '\x7f';
  pcVar22[0x80] = '\0';
  pcVar22[0x81] = '\0';
  pcVar22[0x82] = -0x80;
  pcVar22[0x83] = '\x7f';
  pcVar22[0x84] = '\0';
  pcVar22[0x85] = '\0';
  pcVar22[0x86] = -0x80;
  pcVar22[0x87] = '\x7f';
  pcVar22[0x88] = '\0';
  pcVar22[0x89] = '\0';
  pcVar22[0x8a] = -0x80;
  pcVar22[0x8b] = '\x7f';
  pcVar22[0x8c] = '\0';
  pcVar22[0x8d] = '\0';
  pcVar22[0x8e] = -0x80;
  pcVar22[0x8f] = '\x7f';
  pcVar22[0x90] = '\0';
  pcVar22[0x91] = '\0';
  pcVar22[0x92] = -0x80;
  pcVar22[0x93] = '\x7f';
  pcVar22[0x94] = '\0';
  pcVar22[0x95] = '\0';
  pcVar22[0x96] = -0x80;
  pcVar22[0x97] = '\x7f';
  pcVar22[0x98] = '\0';
  pcVar22[0x99] = '\0';
  pcVar22[0x9a] = -0x80;
  pcVar22[0x9b] = '\x7f';
  pcVar22[0x9c] = '\0';
  pcVar22[0x9d] = '\0';
  pcVar22[0x9e] = -0x80;
  pcVar22[0x9f] = '\x7f';
  pcVar22[0x40] = '\0';
  pcVar22[0x41] = '\0';
  pcVar22[0x42] = -0x80;
  pcVar22[0x43] = '\x7f';
  pcVar22[0x44] = '\0';
  pcVar22[0x45] = '\0';
  pcVar22[0x46] = -0x80;
  pcVar22[0x47] = '\x7f';
  pcVar22[0x48] = '\0';
  pcVar22[0x49] = '\0';
  pcVar22[0x4a] = -0x80;
  pcVar22[0x4b] = '\x7f';
  pcVar22[0x4c] = '\0';
  pcVar22[0x4d] = '\0';
  pcVar22[0x4e] = -0x80;
  pcVar22[0x4f] = '\x7f';
  pcVar22[0x50] = '\0';
  pcVar22[0x51] = '\0';
  pcVar22[0x52] = -0x80;
  pcVar22[0x53] = '\x7f';
  pcVar22[0x54] = '\0';
  pcVar22[0x55] = '\0';
  pcVar22[0x56] = -0x80;
  pcVar22[0x57] = '\x7f';
  pcVar22[0x58] = '\0';
  pcVar22[0x59] = '\0';
  pcVar22[0x5a] = -0x80;
  pcVar22[0x5b] = '\x7f';
  pcVar22[0x5c] = '\0';
  pcVar22[0x5d] = '\0';
  pcVar22[0x5e] = -0x80;
  pcVar22[0x5f] = '\x7f';
  pcVar22[0xe0] = '\0';
  pcVar22[0xe1] = '\0';
  pcVar22[0xe2] = -0x80;
  pcVar22[0xe3] = -1;
  pcVar22[0xe4] = '\0';
  pcVar22[0xe5] = '\0';
  pcVar22[0xe6] = -0x80;
  pcVar22[0xe7] = -1;
  pcVar22[0xe8] = '\0';
  pcVar22[0xe9] = '\0';
  pcVar22[0xea] = -0x80;
  pcVar22[0xeb] = -1;
  pcVar22[0xec] = '\0';
  pcVar22[0xed] = '\0';
  pcVar22[0xee] = -0x80;
  pcVar22[0xef] = -1;
  pcVar22[0xf0] = '\0';
  pcVar22[0xf1] = '\0';
  pcVar22[0xf2] = -0x80;
  pcVar22[0xf3] = -1;
  pcVar22[0xf4] = '\0';
  pcVar22[0xf5] = '\0';
  pcVar22[0xf6] = -0x80;
  pcVar22[0xf7] = -1;
  pcVar22[0xf8] = '\0';
  pcVar22[0xf9] = '\0';
  pcVar22[0xfa] = -0x80;
  pcVar22[0xfb] = -1;
  pcVar22[0xfc] = '\0';
  pcVar22[0xfd] = '\0';
  pcVar22[0xfe] = -0x80;
  pcVar22[0xff] = -1;
  pcVar22[0xa0] = '\0';
  pcVar22[0xa1] = '\0';
  pcVar22[0xa2] = -0x80;
  pcVar22[0xa3] = -1;
  pcVar22[0xa4] = '\0';
  pcVar22[0xa5] = '\0';
  pcVar22[0xa6] = -0x80;
  pcVar22[0xa7] = -1;
  pcVar22[0xa8] = '\0';
  pcVar22[0xa9] = '\0';
  pcVar22[0xaa] = -0x80;
  pcVar22[0xab] = -1;
  pcVar22[0xac] = '\0';
  pcVar22[0xad] = '\0';
  pcVar22[0xae] = -0x80;
  pcVar22[0xaf] = -1;
  pcVar22[0xb0] = '\0';
  pcVar22[0xb1] = '\0';
  pcVar22[0xb2] = -0x80;
  pcVar22[0xb3] = -1;
  pcVar22[0xb4] = '\0';
  pcVar22[0xb5] = '\0';
  pcVar22[0xb6] = -0x80;
  pcVar22[0xb7] = -1;
  pcVar22[0xb8] = '\0';
  pcVar22[0xb9] = '\0';
  pcVar22[0xba] = -0x80;
  pcVar22[0xbb] = -1;
  pcVar22[0xbc] = '\0';
  pcVar22[0xbd] = '\0';
  pcVar22[0xbe] = -0x80;
  pcVar22[0xbf] = -1;
  pcVar22[0x60] = '\0';
  pcVar22[0x61] = '\0';
  pcVar22[0x62] = -0x80;
  pcVar22[99] = -1;
  pcVar22[100] = '\0';
  pcVar22[0x65] = '\0';
  pcVar22[0x66] = -0x80;
  pcVar22[0x67] = -1;
  pcVar22[0x68] = '\0';
  pcVar22[0x69] = '\0';
  pcVar22[0x6a] = -0x80;
  pcVar22[0x6b] = -1;
  pcVar22[0x6c] = '\0';
  pcVar22[0x6d] = '\0';
  pcVar22[0x6e] = -0x80;
  pcVar22[0x6f] = -1;
  pcVar22[0x70] = '\0';
  pcVar22[0x71] = '\0';
  pcVar22[0x72] = -0x80;
  pcVar22[0x73] = -1;
  pcVar22[0x74] = '\0';
  pcVar22[0x75] = '\0';
  pcVar22[0x76] = -0x80;
  pcVar22[0x77] = -1;
  pcVar22[0x78] = '\0';
  pcVar22[0x79] = '\0';
  pcVar22[0x7a] = -0x80;
  pcVar22[0x7b] = -1;
  pcVar22[0x7c] = '\0';
  pcVar22[0x7d] = '\0';
  pcVar22[0x7e] = -0x80;
  pcVar22[0x7f] = -1;
  for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
    pcVar2 = pcVar22 + lVar15 * 8;
    pcVar2[0] = '\b';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  paVar16 = &local_780[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
  for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
    auVar25 = *(undefined1 (*) [16])paVar16[-1].m128;
    VVar3.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar16->m128;
    *(int *)(pcVar22 + uVar17 * 4 + 0x40) = auVar25._0_4_;
    uVar5 = vextractps_avx(auVar25,1);
    *(undefined4 *)(pcVar22 + uVar17 * 4 + 0x80) = uVar5;
    uVar5 = vextractps_avx(auVar25,2);
    *(undefined4 *)(pcVar22 + uVar17 * 4 + 0xc0) = uVar5;
    *(int *)(pcVar22 + uVar17 * 4 + 0x60) = VVar3.field_0._0_4_;
    uVar5 = vextractps_avx((undefined1  [16])VVar3.field_0,1);
    *(undefined4 *)(pcVar22 + uVar17 * 4 + 0xa0) = uVar5;
    uVar5 = vextractps_avx((undefined1  [16])VVar3.field_0,2);
    *(undefined4 *)(pcVar22 + uVar17 * 4 + 0xe0) = uVar5;
    paVar16 = paVar16 + 7;
  }
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    local_a58.values = (NodeRefPtr<4> (*) [16])&local_9c0;
    local_a58.children =
         (BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
          (*) [16])local_780;
    local_a58.this =
         (BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleM<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)local_a40,(context_traits)0x4,CUSTOM_CTX);
    local_930.alloc_barrier = false;
    local_930._9_7_ = 0;
    local_930.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ = 1;
    local_938.func = &local_a58;
    local_930.depth = uVar13;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::avx::GeneralBVHBuilder::BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<8>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<8>,embree::avx::CreateLeafSpatial<8,embree::TriangleMv<4>>>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::Scene___ge<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&local_930,&local_938,(task_group_context *)local_a40
              );
    cVar11 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_a40);
    if (cVar11 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)local_a40);
    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
      *(size_t *)(pcVar22 + uVar17 * 8) = (&local_9c0.depth)[uVar17];
    }
  }
  else {
    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      NVar14 = recurse(this,current_00,alloc_01,false);
      (&local_9c0.depth)[uVar17] = NVar14.ptr;
      current_00 = current_00 + 1;
    }
    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
      *(size_t *)(pcVar22 + uVar17 * 8) = (&local_9c0.depth)[uVar17];
    }
  }
  return (NodeRefPtr<8>)(size_t)pcVar22;
}

Assistant:

const ReductionTy recurse(BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            auto split = heuristic.find(current.prims,cfg.logBlockSize);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*halfArea(current.prims.geomBounds)+cfg.intCost*split.splitSAH();
            assert((current.prims.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.prims.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.prims.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              heuristic.deterministic_order(current.prims);
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            Set lprims,rprims;
            heuristic.split(split,current.prims,lprims,rprims);
	    
            /*! initialize child list with initial split */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            children[0] = BuildRecord(current.depth+1,lprims);
            children[1] = BuildRecord(current.depth+1,rprims);
            size_t numChildren = 2;

            /*! split until node is full or SAH tells us to stop */
            while (numChildren < cfg.branchingFactor)
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.minLeafSize) continue;

                /* find child with largest surface area */
                if (halfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i;
                  bestArea = halfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              auto split = heuristic.find(brecord.prims,cfg.logBlockSize);
              heuristic.split(split,brecord.prims,lrecord.prims,rrecord.prims);
              children[bestChild  ] = lrecord;
              children[numChildren] = rrecord;
              numChildren++;
            }

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* sort buildrecords for faster shadow ray traversal */
            std::sort(&children[0],&children[numChildren],std::greater<BuildRecord>());

            /*! create an inner node */
            auto node = createNode(children,numChildren,alloc);

            /* spawn tasks */
            if (current.size() > cfg.singleThreadThreshold)
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) { // FIXME: no range here
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              return updateNode(current,children,node,values,numChildren);
            }
            /* recurse into each child */
            else
            {
              for (size_t i=0; i<numChildren; i++)
                values[i] = recurse(children[i],alloc,false);

              return updateNode(current,children,node,values,numChildren);
            }
          }